

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DLevelScript::SetActorProperty(DLevelScript *this,int tid,int property,int value)

{
  AActor **ppAVar1;
  AActor *pAVar2;
  
  if (tid != 0) {
    pAVar2 = (AActor *)0x0;
    while( true ) {
      ppAVar1 = &pAVar2->inext;
      if (pAVar2 == (AActor *)0x0) {
        ppAVar1 = (AActor **)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
      }
      for (pAVar2 = *ppAVar1; (pAVar2 != (AActor *)0x0 && (pAVar2->tid != tid));
          pAVar2 = pAVar2->inext) {
      }
      if (pAVar2 == (AActor *)0x0) break;
      DoSetActorProperty(this,pAVar2,property,value);
    }
    return;
  }
  pAVar2 = (this->activator).field_0.p;
  if ((pAVar2 != (AActor *)0x0) &&
     (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->activator).field_0.p = (AActor *)0x0;
    pAVar2 = (AActor *)0x0;
  }
  DoSetActorProperty(this,pAVar2,property,value);
  return;
}

Assistant:

void DLevelScript::SetActorProperty (int tid, int property, int value)
{
	if (tid == 0)
	{
		DoSetActorProperty (activator, property, value);
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (tid);

		while ((actor = iterator.Next()) != NULL)
		{
			DoSetActorProperty (actor, property, value);
		}
	}
}